

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O3

void deqp::ub::anon_unknown_1::generateDeclaration
               (ostringstream *src,VarType *type,char *name,int indentLevel,deUint32 unusedHints)

{
  int iVar1;
  Type TVar2;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  ostream *poVar6;
  int *piVar7;
  int *piVar8;
  vector<int,_std::allocator<int>_> arraySizes;
  PrecisionFlagsFmt local_4c;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar3 = type->m_flags;
  if ((uVar3 & 0xf8) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>,"layout(",7);
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)(CONCAT44(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,uVar3) & 0xffffffff000000f8);
    ub::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,
                   (LayoutFlagsFmt *)&local_48);
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>,") ",2);
  }
  if ((uVar3 & 7) != 0) {
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)(CONCAT44(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,uVar3) & 0xffffffff00000007);
    ub::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,
                   (PrecisionFlagsFmt *)&local_48);
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>," ",1);
  }
  iVar1 = (int)src;
  if (type->m_type == TYPE_ARRAY) {
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (int *)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    TVar2 = TYPE_ARRAY;
    while (TVar2 == TYPE_ARRAY) {
      local_4c.flags = (type->m_data).array.size;
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_48,
                   (iterator)
                   local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_4c);
      }
      else {
        *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_4c.flags;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      type = (type->m_data).array.elementType;
      TVar2 = type->m_type;
    }
    if (TVar2 == TYPE_BASIC) {
      uVar3 = type->m_flags & 7;
      if (uVar3 != 0) {
        local_4c.flags = uVar3;
        ub::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,&local_4c);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&src->super_basic_ostream<char,_std::char_traits<char>_>," ",1);
      }
      pcVar4 = glu::getDataTypeName((type->m_data).basicType);
      if (pcVar4 == (char *)0x0) {
        std::ios::clear(iVar1 + (int)(src->super_basic_ostream<char,_std::char_traits<char>_>).
                                     _vptr_basic_ostream[-3]);
      }
      else {
        sVar5 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&src->super_basic_ostream<char,_std::char_traits<char>_>,pcVar4,sVar5);
      }
    }
    else {
      generateLocalDeclaration(src,(type->m_data).structPtr,indentLevel + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>," ",1);
    if (name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)(src->super_basic_ostream<char,_std::char_traits<char>_>).
                                   _vptr_basic_ostream[-3]);
      piVar7 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar8 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    else {
      sVar5 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>
                (&src->super_basic_ostream<char,_std::char_traits<char>_>,name,sVar5);
      piVar7 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar8 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    for (; piVar8 != local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start; piVar8 = piVar8 + -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&src->super_basic_ostream<char,_std::char_traits<char>_>,"[",1);
      poVar6 = (ostream *)std::ostream::operator<<(src,piVar8[-1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
      piVar7 = piVar7 + -1;
    }
    if (piVar8 != (int *)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage - (long)piVar7);
    }
  }
  else if (type->m_type == TYPE_BASIC) {
    pcVar4 = glu::getDataTypeName((type->m_data).basicType);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear(iVar1 + (int)(src->super_basic_ostream<char,_std::char_traits<char>_>).
                                   _vptr_basic_ostream[-3]);
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                (&src->super_basic_ostream<char,_std::char_traits<char>_>,pcVar4,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>," ",1);
    if (name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)(src->super_basic_ostream<char,_std::char_traits<char>_>).
                                   _vptr_basic_ostream[-3]);
    }
    else {
      sVar5 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>
                (&src->super_basic_ostream<char,_std::char_traits<char>_>,name,sVar5);
    }
  }
  else {
    generateLocalDeclaration(src,(type->m_data).structPtr,indentLevel + 1);
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>," ",1);
    if (name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)(src->super_basic_ostream<char,_std::char_traits<char>_>).
                                   _vptr_basic_ostream[-3]);
    }
    else {
      sVar5 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>
                (&src->super_basic_ostream<char,_std::char_traits<char>_>,name,sVar5);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&src->super_basic_ostream<char,_std::char_traits<char>_>,";",1);
  if (unusedHints != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>," // unused in ",0xe);
    if (unusedHints == 0x400) {
      pcVar4 = "vertex shader";
    }
    else if (unusedHints == 0xc00) {
      pcVar4 = "both shaders";
    }
    else {
      pcVar4 = "???";
      if (unusedHints == 0x800) {
        pcVar4 = "fragment shader";
      }
    }
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>,pcVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&src->super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
  return;
}

Assistant:

void generateDeclaration(std::ostringstream& src, const VarType& type, const char* name, int indentLevel,
						 deUint32 unusedHints)
{
	deUint32 flags = type.getFlags();

	if ((flags & LAYOUT_MASK) != 0)
		src << "layout(" << LayoutFlagsFmt(flags & LAYOUT_MASK) << ") ";

	if ((flags & PRECISION_MASK) != 0)
		src << PrecisionFlagsFmt(flags & PRECISION_MASK) << " ";

	if (type.isBasicType())
		src << glu::getDataTypeName(type.getBasicType()) << " " << name;
	else if (type.isArrayType())
	{
		std::vector<int> arraySizes;
		const VarType*   curType = &type;
		while (curType->isArrayType())
		{
			arraySizes.push_back(curType->getArraySize());
			curType = &curType->getElementType();
		}

		if (curType->isBasicType())
		{
			if ((curType->getFlags() & PRECISION_MASK) != 0)
				src << PrecisionFlagsFmt(curType->getFlags() & PRECISION_MASK) << " ";
			src << glu::getDataTypeName(curType->getBasicType());
		}
		else
		{
			DE_ASSERT(curType->isStructType());
			generateLocalDeclaration(src, curType->getStruct(), indentLevel + 1);
		}

		src << " " << name;

		for (std::vector<int>::const_reverse_iterator sizeIter = arraySizes.rbegin(); sizeIter != arraySizes.rend();
			 sizeIter++)
			src << "[" << *sizeIter << "]";
	}
	else
	{
		generateLocalDeclaration(src, type.getStruct(), indentLevel + 1);
		src << " " << name;
	}

	src << ";";

	// Print out unused hints.
	if (unusedHints != 0)
		src << " // unused in "
			<< (unusedHints == UNUSED_BOTH ?
					"both shaders" :
					unusedHints == UNUSED_VERTEX ? "vertex shader" :
												   unusedHints == UNUSED_FRAGMENT ? "fragment shader" : "???");

	src << "\n";
}